

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  Arena *pAVar1;
  SerialArena *this;
  __int_type_conflict _Var2;
  bool bVar3;
  uint32_t size;
  uint uVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar5;
  void *x;
  RepeatedPtrFieldBase *this_00;
  long lVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 s;
  ushort *p;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  LogMessage *this_01;
  string *s_00;
  ulong uVar8;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar9;
  uint *puVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *ctx_00;
  uint32_t *out;
  size_t offset;
  uint64_t uVar11;
  ushort uVar12;
  ushort v;
  string_view wire_bytes;
  string_view wire_bytes_00;
  uint32_t next_tag;
  uint64_t local_58;
  uint32_t *local_50 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_38;
  
  uVar11 = hasbits;
  aVar5 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
          RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  s._0_4_ = data.field_0._0_4_ & 7;
  s.data._4_4_ = 0;
  if (s._0_4_ != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_001586ca;
  }
  uVar12 = *(uint16_t *)(aVar5.data + 10);
  v = uVar12 & 0x1c0;
  local_58 = hasbits;
  local_38 = data.field_0;
  x = MaybeGetSplitBase(msg,true,table);
  if (v != 0x100) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x8f1);
    this_01 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        ((LogMessage *)local_50,(char (*) [34])"Unsupported repeated string rep: ");
    absl::lts_20240722::log_internal::LogMessage::operator<<(this_01,v);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_50)
    ;
  }
  uVar12 = uVar12 & 0x600;
  out = (uint32_t *)(ulong)*(uint *)aVar5;
  local_40 = aVar5;
  this_00 = &MaybeCreateRepeatedRefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>,true>
                       (x,(size_t)out,msg)->super_RepeatedPtrFieldBase;
  pAVar1 = this_00->arena_;
  if (pAVar1 == (Arena *)0x0) {
LAB_00158627:
    do {
      s_00 = (string *)RepeatedPtrFieldBase::AddString(this_00);
      p = (ushort *)InlineGreedyStringParser(s_00,ptr,ctx);
      ctx_00 = extraout_RDX_02;
      if (p == (ushort *)0x0) goto LAB_0015870d;
      ptr = (s_00->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)ptr;
      s = local_40;
      bVar3 = MpVerifyUtf8((TcParser *)s_00->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)local_40,(FieldEntry *)(ulong)uVar12,(uint16_t)uVar11
                          );
      ctx_00 = extraout_RDX_03;
      if (!bVar3) goto LAB_0015870d;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_001586da;
      ptr = ReadTag((char *)p,&next_tag,0);
    } while (next_tag == (uint32_t)local_38.data);
  }
  else {
    lVar6 = __tls_get_addr(&PTR_001b1f10);
    s = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
        ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar6 + 8))->data;
    if (s.data != *(ulong *)pAVar1) goto LAB_00158627;
    this = *(SerialArena **)(lVar6 + 0x10);
    bVar3 = RepeatedPtrFieldBase::PrepareForParse(this_00);
    if (!bVar3) goto LAB_00158627;
    do {
      local_50[0] = (uint32_t *)ptr;
      size = ReadSize((char **)local_50);
      ctx_00 = extraout_RDX;
      ptr = (char *)out;
      if (local_50[0] == (uint32_t *)0x0) {
LAB_0015870d:
        pcVar9 = Error(msg,ptr,ctx_00,(TcFieldData)s,table,local_58);
        return pcVar9;
      }
      _Var2 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var2 == 0) {
        s = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        offset = _Var2 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = offset;
        s = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            StringBlock::AtOffset_abi_cxx11_((this->string_block_)._M_b._M_p,offset);
      }
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(s.data + 0x10);
      *(size_type *)(s.data + 8) = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(s.data + 0x10))->_M_local_buf[0] = '\0';
      RepeatedPtrFieldBase::AddAllocatedForParse(this_00,(void *)s);
      ptr = (char *)local_50[0];
      p = (ushort *)
          EpsCopyInputStream::ReadString
                    (&ctx->super_EpsCopyInputStream,(char *)local_50[0],size,(string *)s);
      ctx_00 = extraout_RDX_00;
      if (p == (ushort *)0x0) goto LAB_0015870d;
      pVVar7 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (this_00,this_00->current_size_ + -1);
      ptr = (pVVar7->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)ptr;
      s = local_40;
      bVar3 = MpVerifyUtf8((TcParser *)pVVar7->_M_string_length,wire_bytes,
                           (TcParseTableBase *)local_40,(FieldEntry *)(ulong)uVar12,(uint16_t)uVar11
                          );
      ctx_00 = extraout_RDX_01;
      if (!bVar3) goto LAB_0015870d;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_001586da;
      out = &next_tag;
      ptr = ReadTag((char *)p,out,0);
    } while (next_tag == (uint32_t)local_38.data);
  }
  ptr = (char *)p;
  p = (ushort *)ptr;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_001586da:
    if (table->has_bits_offset != 0) {
      puVar10 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar10 = *puVar10 | (uint)local_58;
    }
    return (char *)p;
  }
  uVar4 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar4 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar8 = (ulong)(uVar4 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar8);
  hasbits = local_58;
LAB_001586ca:
  pcVar9 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (PROTOBUF_PREDICT_TRUE(
              arena != nullptr &&
              arena->impl_.GetSerialArenaFast(&serial_arena) &&
              field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr ||
                                     !MpVerifyUtf8(field[field.size() - 1],
                                                   table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (PROTOBUF_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}